

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_CreateString(char *string)

{
  cJSON *c;
  size_t sVar1;
  char *__dest;
  
  c = (cJSON *)(*cJSON_malloc)(0x40);
  if (c != (cJSON *)0x0) {
    c->child = (cJSON *)0x0;
    *(undefined8 *)&c->type = 0;
    c->valuedouble = 0.0;
    c->string = (char *)0x0;
    c->valuestring = (char *)0x0;
    *(undefined8 *)&c->valueint = 0;
    c->next = (cJSON *)0x0;
    c->prev = (cJSON *)0x0;
    c->type = 0x10;
    sVar1 = strlen(string);
    __dest = (char *)(*cJSON_malloc)(sVar1 + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,string,sVar1 + 1);
      c->valuestring = __dest;
      return c;
    }
    c->valuestring = (char *)0x0;
    cJSON_Delete(c);
  }
  return (cJSON *)0x0;
}

Assistant:

cJSON *cJSON_CreateString(const char *string)	{cJSON *item=cJSON_New_Item();if(item){item->type=cJSON_String;item->valuestring=cJSON_strdup(string);if(!item->valuestring){cJSON_Delete(item);return 0;}}return item;}